

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_schnorrsig.cpp
# Opt level: O0

void __thiscall SchnorrSig_SignWithNonce_Test::TestBody(SchnorrSig_SignWithNonce_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_b0;
  Message local_a8;
  string local_a0;
  undefined1 local_80 [8];
  AssertionResult gtest_ar;
  SchnorrSignature sig;
  allocator local_31;
  undefined1 local_30 [8];
  string expected_sig;
  SchnorrSig_SignWithNonce_Test *this_local;
  
  expected_sig.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_30,
             "5da618c1936ec728e5ccff29207f1680dcf4146370bdcfab0039951b91e3637a958e91d68537d1f6f19687cec1fd5db1d83da56ef3ade1f3c611babd7d08af42"
             ,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  cfd::core::SchnorrUtil::SignWithNonce
            ((SchnorrSignature *)&gtest_ar.message_,&::msg,&::sk,&::nonce);
  cfd::core::SchnorrSignature::GetHex_abi_cxx11_
            (&local_a0,(SchnorrSignature *)&gtest_ar.message_,false);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_80,"expected_sig","sig.GetHex()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,&local_a0
            );
  std::__cxx11::string::~string((string *)&local_a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x30,message);
    testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  cfd::core::SchnorrSignature::~SchnorrSignature((SchnorrSignature *)&gtest_ar.message_);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(SchnorrSig, SignWithNonce) {
  std::string expected_sig =
      "5da618c1936ec728e5ccff29207f1680dcf4146370bdcfab0039951b91e3637a958e91d"
      "68537d1f6f19687cec1fd5db1d83da56ef3ade1f3c611babd7d08af42";

  auto sig = SchnorrUtil::SignWithNonce(msg, sk, nonce);

  EXPECT_EQ(expected_sig, sig.GetHex());
}